

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::Slot
          (ByteCodeWriter *this,OpCode op,RegSlot value,RegSlot instance,uint32 slotId,
          ProfileId profileId)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  undefined4 *puVar3;
  OpLayoutType local_28;
  ProfileId PStack_22;
  bool success;
  uint32 local_20;
  RegSlot RStack_1c;
  ProfileId profileId_local;
  uint32 slotId_local;
  RegSlot instance_local;
  RegSlot value_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  PStack_22 = profileId;
  local_20 = slotId;
  RStack_1c = instance;
  slotId_local = value;
  instance_local._2_2_ = op;
  _value_local = this;
  CheckOpen(this);
  op_00 = instance_local._2_2_;
  OpLayoutType::OpLayoutType(&local_28,ElementSlot);
  CheckOp(this,op_00,local_28);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(instance_local._2_2_);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x643,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  slotId_local = ConsumeReg(this,slotId_local);
  RStack_1c = ConsumeReg(this,RStack_1c);
  if ((instance_local._2_2_ == LdSlot) || (instance_local._2_2_ == LdObjSlot)) {
    bVar2 = DoDynamicProfileOpcode(this,AggressiveIntTypeSpecPhase,false);
    if (((bVar2) || (bVar2 = DoDynamicProfileOpcode(this,FloatTypeSpecPhase,false), bVar2)) &&
       (PStack_22 != 0xffff)) {
      OpCodeUtil::ConvertNonCallOpToProfiled((OpCode *)((long)&instance_local + 2));
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x654,"(false)",
                                "The specified OpCode is not intended for slot access");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = TryWriteElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,instance_local._2_2_,slotId_local,RStack_1c,local_20);
  if (((!bVar2) &&
      (bVar2 = TryWriteElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                         (this,instance_local._2_2_,slotId_local,RStack_1c,local_20), !bVar2)) &&
     (bVar2 = TryWriteElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,instance_local._2_2_,slotId_local,RStack_1c,local_20), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x658,"(success)","success");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = OpCodeAttr::IsProfiledOp(instance_local._2_2_);
  if (bVar2) {
    Data::Encode(&this->m_byteCodeData,&stack0xffffffffffffffde,2);
  }
  return;
}

Assistant:

void ByteCodeWriter::Slot(OpCode op, RegSlot value, RegSlot instance, uint32 slotId, ProfileId profileId)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementSlot);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        value = ConsumeReg(value);
        instance = ConsumeReg(instance);

        switch (op)
        {
        case OpCode::LdSlot:
        case OpCode::LdObjSlot:
            if ((DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) || DoDynamicProfileOpcode(FloatTypeSpecPhase)) &&
                profileId != Constants::NoProfileId)
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
            }
            break;

        default:
            AssertMsg(false, "The specified OpCode is not intended for slot access");
            break;
        }

        MULTISIZE_LAYOUT_WRITE(ElementSlot, op, value, instance, slotId);
        if (OpCodeAttr::IsProfiledOp(op))
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
        }
    }